

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O1

void __thiscall duckdb::BinarySerializer::VarIntEncode<long>(BinarySerializer *this,long value)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  uint8_t buffer [16];
  byte local_18 [24];
  
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_18[4] = 0;
  local_18[5] = 0;
  local_18[6] = 0;
  local_18[7] = 0;
  local_18[8] = 0;
  local_18[9] = 0;
  local_18[10] = 0;
  local_18[0xb] = 0;
  local_18[0xc] = 0;
  local_18[0xd] = 0;
  local_18[0xe] = 0;
  local_18[0xf] = 0;
  lVar4 = 0;
  do {
    bVar3 = (byte)value & 0x7f;
    uVar2 = value >> 7;
    bVar5 = 0x3f < (ulong)value;
    if (bVar5) {
      bVar3 = bVar3 | ((value & 0x40U) == 0 || uVar2 != 0xffffffffffffffff) << 7;
    }
    uVar1 = value & 0x40;
    local_18[lVar4] = bVar3;
    lVar4 = lVar4 + 1;
    value = uVar2;
  } while (bVar5 && (uVar1 == 0 || uVar2 != 0xffffffffffffffff));
  (**this->stream->_vptr_WriteStream)(this->stream,local_18);
  return;
}

Assistant:

void VarIntEncode(T value) {
		uint8_t buffer[16] = {};
		auto write_size = EncodingUtil::EncodeLEB128<T>(buffer, value);
		D_ASSERT(write_size <= sizeof(buffer));
		WriteData(buffer, write_size);
	}